

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample1D
          (SampleVerifier *this,IVec3 *texelBase,float weight,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  int i;
  long lVar1;
  long lVar2;
  double *pdVar3;
  Vec4 *pVVar4;
  Interval *x;
  Vec4 *pVVar5;
  int compNdx;
  bool bVar6;
  float fVar7;
  Interval texelInterval;
  Interval weightInterval;
  Vec4 texelsMax [2];
  Vec4 texelsMin [2];
  Interval resultIntervals [4];
  Interval local_170;
  Vec4 *local_158;
  Vec4 *local_150;
  long local_148;
  Interval local_140;
  Vec4 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  Vec4 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Interval local_e0;
  Interval local_c8 [4];
  Interval local_60;
  Interval local_48;
  
  local_f8 = 0;
  uStack_f0 = 0;
  local_108.m_data[0] = 0.0;
  local_108.m_data[1] = 0.0;
  local_108.m_data[2] = 0.0;
  local_108.m_data[3] = 0.0;
  local_118 = 0;
  uStack_110 = 0;
  local_128.m_data[0] = 0.0;
  local_128.m_data[1] = 0.0;
  local_128.m_data[2] = 0.0;
  local_128.m_data[3] = 0.0;
  lVar2 = 0;
  local_158 = resultMin;
  local_150 = resultMax;
  do {
    local_140.m_hasNaN = SUB41((int)lVar2,0);
    local_140._1_3_ = SUB43((int)lVar2,1);
    local_140._4_8_ = 0;
    local_c8[0].m_hasNaN = false;
    local_c8[0]._1_7_ = 0;
    local_c8[0].m_lo._0_4_ = 0;
    lVar1 = 0;
    do {
      *(int *)(&local_c8[0].m_hasNaN + lVar1 * 4) =
           *(int *)(&local_140.m_hasNaN + lVar1 * 4) + texelBase->m_data[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    fetchTexel(this,(IVec3 *)local_c8,layer,level,VK_FILTER_LINEAR,&local_108 + lVar2,
               &local_128 + lVar2);
    bVar6 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar6);
  lVar2 = 0x10;
  do {
    *(undefined1 *)((long)local_c8 + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)local_c8 + lVar2 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&local_c8[0].m_hasNaN + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x70);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)local_c8 + lVar2 + -8) = 0;
    *(undefined8 *)(&local_c8[0].m_hasNaN + lVar2) = 0;
    *(undefined8 *)((long)&local_c8[0].m_lo + lVar2) = 0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  pVVar4 = &local_128;
  pVVar5 = &local_108;
  lVar2 = 0;
  do {
    fVar7 = 1.0 - weight;
    if (lVar2 != 0) {
      fVar7 = weight;
    }
    local_170.m_hasNaN = NAN(fVar7);
    local_170.m_lo = INFINITY;
    if (!local_170.m_hasNaN) {
      local_170.m_lo = (double)fVar7;
    }
    local_170.m_hi = -INFINITY;
    if (!local_170.m_hasNaN) {
      local_170.m_hi = (double)fVar7;
    }
    local_148 = lVar2;
    tcu::FloatFormat::roundOut(&local_140,&this->m_filteringPrecision,&local_170,false);
    x = local_c8;
    lVar2 = 0;
    do {
      local_170.m_lo = (double)pVVar5->m_data[lVar2];
      local_170.m_hi = (double)pVVar4->m_data[lVar2];
      local_170.m_hasNaN = false;
      tcu::operator*(&local_60,&local_140,&local_170);
      tcu::operator+(&local_48,x,&local_60);
      tcu::FloatFormat::roundOut(&local_e0,&this->m_filteringPrecision,&local_48,false);
      x->m_hi = local_e0.m_hi;
      x->m_hasNaN = local_e0.m_hasNaN;
      *(undefined7 *)&x->field_0x1 = local_e0._1_7_;
      x->m_lo = local_e0.m_lo;
      lVar2 = lVar2 + 1;
      x = x + 1;
    } while (lVar2 != 4);
    lVar2 = local_148 + 1;
    pVVar4 = pVVar4 + 1;
    pVVar5 = pVVar5 + 1;
  } while (local_148 == 0);
  pdVar3 = &local_c8[0].m_hi;
  lVar2 = 0;
  do {
    local_158->m_data[lVar2] = (float)pdVar3[-1];
    local_150->m_data[lVar2] = (float)*pdVar3;
    lVar2 = lVar2 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar2 != 4);
  return;
}

Assistant:

void SampleVerifier::getFilteredSample1D (const IVec3&	texelBase,
										  float			weight,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[2];
	Vec4 texelsMax[2];

	for (int i = 0; i < 2; ++i)
	{
	    fetchTexel(texelBase + IVec3(i, 0, 0), layer, level, VK_FILTER_LINEAR, texelsMin[i], texelsMax[i]);
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

    for (int i = 0; i < 2; ++i)
	{
		const Interval weightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weight : weight), false);

		for (int compNdx = 0; compNdx < 4; ++compNdx)
		{
			const Interval texelInterval(false, texelsMin[i][compNdx], texelsMax[i][compNdx]);

			resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + weightInterval * texelInterval, false);
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}